

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O1

string * __thiscall
cppcms::archive::read_chunk_as_string_abi_cxx11_(string *__return_storage_ptr__,archive *this)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = next_chunk_size(this);
  pcVar1 = (this->buffer_)._M_dataplus._M_p;
  sVar2 = this->ptr_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1 + sVar2 + 4,pcVar1 + sVar3 + sVar2 + 4);
  this->ptr_ = this->ptr_ + sVar3 + 4;
  return __return_storage_ptr__;
}

Assistant:

std::string archive::read_chunk_as_string()
{
	size_t size = next_chunk_size();
	std::string result(buffer_.c_str() + ptr_ + 4,size);
	ptr_ +=4+size;
	return result;
}